

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::NotImplementedException::NotImplementedException
          (NotImplementedException *this,SourceLineInfo *lineInfo)

{
  ostream *poVar1;
  string local_1c0 [32];
  ostringstream local_1a0 [8];
  ostringstream oss;
  SourceLineInfo *lineInfo_local;
  NotImplementedException *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__NotImplementedException_001fa758;
  std::__cxx11::string::string((string *)&this->m_what);
  SourceLineInfo::SourceLineInfo(&this->m_lineInfo,lineInfo);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = Catch::operator<<((ostream *)local_1a0,lineInfo);
  std::operator<<(poVar1,": function ");
  std::operator<<((ostream *)local_1a0,"not implemented");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_what,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

NotImplementedException::NotImplementedException( SourceLineInfo const& lineInfo )
    :   m_lineInfo( lineInfo ) {
        std::ostringstream oss;
        oss << lineInfo << ": function ";
        oss << "not implemented";
        m_what = oss.str();
    }